

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx86_64-ABI-code.c
# Opt level: O3

void update_last_qword_type(c2m_ctx_t c2m_ctx,type *type,MIR_type_t *qword_types,int n)

{
  ulong uVar1;
  mir_size_t mVar2;
  uint uVar3;
  MIR_type_t MVar4;
  ulong uVar5;
  
  mVar2 = raw_type_size(c2m_ctx,type);
  uVar5 = (ulong)type->align;
  if (uVar5 != 0) {
    uVar1 = (mVar2 - 1) + uVar5;
    mVar2 = uVar1 - uVar1 % uVar5;
  }
  if ((n < 2) && (uVar3 = (uint)mVar2 & 7, (mVar2 & 7) != 0)) {
    MVar4 = MIR_T_F;
    if (4 < uVar3 || qword_types[(long)n + -1] != MIR_T_D) {
      if (qword_types[(long)n + -1] != MIR_T_I64 || 4 < uVar3) {
        return;
      }
      MVar4 = (uVar3 != 2) + 2 + (uint)(uVar3 != 2);
      if (uVar3 < 2) {
        MVar4 = MIR_T_I8;
      }
    }
    qword_types[(long)n + -1] = MVar4;
  }
  return;
}

Assistant:

static void update_last_qword_type (c2m_ctx_t c2m_ctx, struct type *type,
                                    MIR_type_t qword_types[MAX_QWORDS], int n) {
  size_t last_size, size = type_size (c2m_ctx, type);
  MIR_type_t mir_type;

  assert (n != 0);
  if ((last_size = size % 8) == 0 || n > 1) return;
  mir_type = qword_types[n - 1];
  if (last_size <= 4 && mir_type == MIR_T_D) qword_types[n - 1] = MIR_T_F;
  if (last_size <= 4 && mir_type == MIR_T_I64)
    qword_types[n - 1] = last_size <= 1 ? MIR_T_I8 : last_size <= 2 ? MIR_T_I16 : MIR_T_I32;
}